

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_rawget(lua_State *L,int idx)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *pTVar4;
  
  pTVar4 = index2addr(L,idx);
  pTVar1 = L->top;
  pTVar4 = luaH_get((Table *)(pTVar4->value_).gc,pTVar1 + -1);
  iVar2 = pTVar4->tt_;
  uVar3 = *(undefined4 *)&pTVar4->field_0xc;
  pTVar1[-1].value_ = pTVar4->value_;
  pTVar1[-1].tt_ = iVar2;
  *(undefined4 *)&pTVar1[-1].field_0xc = uVar3;
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_rawget (lua_State *L, int idx) {
  Table *t;
  const TValue *val;
  lua_lock(L);
  api_checknelems(L, 1);
  t = gettable(L, idx);
  val = luaH_get(t, s2v(L->top - 1));
  L->top--;  /* remove key */
  return finishrawget(L, val);
}